

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TileLayerParams::SerializeWithCachedSizes
          (TileLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  uint64 value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TileLayerParams *this_local;
  
  iVar1 = reps_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_reps_cached_byte_size_);
  }
  local_20 = 0;
  iVar1 = reps_size(this);
  for (; local_20 < iVar1; local_20 = local_20 + 1) {
    value = reps(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(value,output);
  }
  return;
}

Assistant:

void TileLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TileLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 reps = 1;
  if (this->reps_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_reps_cached_byte_size_);
  }
  for (int i = 0, n = this->reps_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->reps(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TileLayerParams)
}